

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int pack_particle_slice(int left,int width,vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int k;
  int k_00;
  int iVar1;
  int j;
  int j_00;
  int i;
  size_t p_index;
  size_t pn_index;
  size_t local_40 [2];
  
  iVar1 = width + left;
  local_40[1] = 0;
  local_40[0] = 0;
  for (; left < iVar1; left = left + 1) {
    for (j_00 = 0; j_00 < ny_global; j_00 = j_00 + 1) {
      for (k_00 = 0; k_00 < nz_global; k_00 = k_00 + 1) {
        pack_cell(left,j_00,k_00,particle_numbers,local_40 + 1,particles,local_40);
      }
    }
  }
  return (int)local_40[0];
}

Assistant:

int pack_particle_slice(int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(i, j, k, particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}